

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdcat.c
# Opt level: O3

void bsdcat_read_to_stdout(char *filename)

{
  char *pcVar1;
  wchar_t wVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  
  wVar2 = archive_read_open_filename(a,filename,0x2800);
  if (wVar2 == L'\0') {
    uVar3 = archive_read_next_header(a,&ae);
    if (uVar3 < 2) {
      if (uVar3 == 1) goto LAB_001027d0;
      iVar4 = archive_read_data_into_fd(a,1);
      if (iVar4 == 0) goto LAB_001027d0;
    }
  }
  pcVar1 = bsdcat_current_path;
  pcVar5 = archive_error_string(a);
  lafe_warnc(0,"%s: %s",pcVar1,pcVar5);
  exit_status = 1;
LAB_001027d0:
  iVar4 = archive_read_close(a);
  pcVar1 = bsdcat_current_path;
  if (iVar4 != 0) {
    pcVar5 = archive_error_string(a);
    lafe_warnc(0,"%s: %s",pcVar1,pcVar5);
    exit_status = 1;
  }
  archive_read_free(a);
  a = (archive *)0x0;
  return;
}

Assistant:

static void
bsdcat_read_to_stdout(const char* filename)
{
	int r;

	if (archive_read_open_filename(a, filename, BYTES_PER_BLOCK)
	    != ARCHIVE_OK)
		bsdcat_print_error();
	else if (r = archive_read_next_header(a, &ae),
		 r != ARCHIVE_OK && r != ARCHIVE_EOF)
		bsdcat_print_error();
	else if (r == ARCHIVE_EOF)
		/* for empty payloads don't try and read data */
		;
	else if (archive_read_data_into_fd(a, 1) != ARCHIVE_OK)
		bsdcat_print_error();
	if (archive_read_close(a) != ARCHIVE_OK)
		bsdcat_print_error();
	archive_read_free(a);
	a = NULL;
}